

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFObjectHandle::insertItemAndGetNew(QPDFObjectHandle *this,int at,QPDFObjectHandle *item)

{
  QPDFObjectHandle *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  QPDFObjectHandle QVar1;
  QPDFObjectHandle *item_local;
  int at_local;
  QPDFObjectHandle *this_local;
  
  insertItem((QPDFObjectHandle *)CONCAT44(in_register_00000034,at),(int)item,in_RCX);
  QPDFObjectHandle(this,in_RCX);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::insertItemAndGetNew(int at, QPDFObjectHandle const& item)
{
    insertItem(at, item);
    return item;
}